

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  allocator local_39;
  string local_38 [32];
  TestRunInfo *local_18;
  TestRunInfo *runInfo_local;
  JunitReporter *this_local;
  
  local_18 = runInfo;
  runInfo_local = (TestRunInfo *)this;
  CumulativeReporterBase::testRunStarting(&this->super_CumulativeReporterBase,runInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"testsuites",&local_39);
  XmlWriter::startElement(&this->xml,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& runInfo ) {
            CumulativeReporterBase::testRunStarting( runInfo );
            xml.startElement( "testsuites" );
        }